

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

shared_ptr<LNode> __thiscall LParser::reduce_26(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  shared_ptr<LNode> local_e8;
  shared_ptr<LNode> parameters;
  shared_ptr<LNode> name;
  undefined1 local_ac [36];
  shared_ptr<LNodeData<LNodeFCStmt>_> r;
  shared_ptr<LNode> stmts;
  LNodeFCStmt local_60;
  
  get_node((LParser *)&name,in_ESI);
  get_node((LParser *)&parameters,in_ESI);
  get_node((LParser *)&stmts,in_ESI);
  local_ac._0_4_ = 0x2d;
  local_e8.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_ac._20_8_ = parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_ac._28_8_ =
       parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_ac._4_8_ = stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_ac._12_8_ = stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LNodeFCStmt::LNodeFCStmt
            (&local_60,&local_e8,(shared_ptr<LNode> *)(local_ac + 0x14),
             (shared_ptr<LNode> *)(local_ac + 4));
  std::make_shared<LNodeData<LNodeFCStmt>,LNodeType,LNodeFCStmt>
            ((LNodeType *)&r,(LNodeFCStmt *)local_ac);
  LNodeFCStmt::~LNodeFCStmt(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ac + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ac + 0x1c));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Var1 = r.super___shared_ptr<LNodeData<LNodeFCStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  r.super___shared_ptr<LNodeData<LNodeFCStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (LLexer *)r.super___shared_ptr<LNodeData<LNodeFCStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  r.super___shared_ptr<LNodeData<LNodeFCStmt>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r.super___shared_ptr<LNodeData<LNodeFCStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stmts.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&name.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_26() {
    // FCStmt : FUNCTION Var FBRAC Vars KET Brs Stmts END Brs
    auto name = this->get_node(8);
    auto parameters = this->get_node(6);
    auto stmts = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeFCStmt>>(
            LNodeType::FCStmt,
            LNodeFCStmt(std::move(name), std::move(parameters), std::move(stmts))
    );
    return r;
}